

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeAtomicCounterTests.cpp
# Opt level: O3

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::atomic_binding_offset_overlap
               (NegativeTestContext *ctx)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "Atomic counters may not have overlapping offsets in the same binding.","");
  NegativeTestContext::beginSection(ctx,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  iterateShaders(ctx,TESTCASE_LAYOUT_BINDING_OFFSET_OVERLAP);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void atomic_binding_offset_overlap (NegativeTestContext& ctx)
{
	ctx.beginSection("Atomic counters may not have overlapping offsets in the same binding.");
	iterateShaders(ctx, TESTCASE_LAYOUT_BINDING_OFFSET_OVERLAP);
	ctx.endSection();
}